

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O0

void Sbd_ManSolveSelect(Gia_Man_t *p,Vec_Int_t *vMirrors,int Pivot,Vec_Int_t *vDivVars,
                       Vec_Int_t *vDivValues,Vec_Int_t *vWinObjs,Vec_Int_t *vObj2Var,Vec_Int_t *vTfo
                       ,Vec_Int_t *vRoots)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  word Supp;
  int pInds [64];
  uint local_60;
  int local_5c;
  int nVars;
  int Status;
  int FreeVar;
  int PivotVar;
  sat_solver *pSat;
  Vec_Int_t *vTemp;
  Vec_Int_t *vSop;
  Vec_Int_t *vWinObjs_local;
  Vec_Int_t *vDivValues_local;
  Vec_Int_t *vDivVars_local;
  Vec_Int_t *pVStack_18;
  int Pivot_local;
  Vec_Int_t *vMirrors_local;
  Gia_Man_t *p_local;
  
  vSop = vWinObjs;
  vWinObjs_local = vDivValues;
  vDivValues_local = vDivVars;
  vDivVars_local._4_4_ = Pivot;
  pVStack_18 = vMirrors;
  vMirrors_local = (Vec_Int_t *)p;
  vTemp = Vec_IntAlloc(100);
  pSat = (sat_solver *)Vec_IntAlloc(100);
  _FreeVar = Sbd_ManSatSolver((sat_solver *)0x0,(Gia_Man_t *)vMirrors_local,pVStack_18,
                              vDivVars_local._4_4_,vSop,vObj2Var,vTfo,vRoots,0);
  Status = Vec_IntEntry(vObj2Var,vDivVars_local._4_4_);
  iVar1 = Vec_IntSize(vSop);
  iVar2 = Vec_IntSize(vTfo);
  iVar3 = Vec_IntSize(vRoots);
  nVars = iVar1 + iVar2 + iVar3;
  local_5c = Sbd_ManSolve2(_FreeVar,Status,nVars,vDivValues_local,vWinObjs_local,(Vec_Int_t *)pSat,
                           vTemp);
  uVar5 = vDivVars_local._4_4_;
  uVar4 = Vec_IntSize(vDivValues_local);
  printf("Pivot = %4d. Divs = %4d.  ",(ulong)uVar5,(ulong)uVar4);
  if (local_5c == 0) {
    printf("UNSAT.\n");
  }
  else {
    Sbd_ManSolverSupp(vTemp,(int *)&Supp,(int *)&local_60);
    uVar5 = Vec_IntCountEntry(vTemp,-1);
    printf("SAT with %d vars and %d cubes.\n",(ulong)local_60,(ulong)uVar5);
  }
  Vec_IntFree((Vec_Int_t *)pSat);
  Vec_IntFree(vTemp);
  sat_solver_delete(_FreeVar);
  return;
}

Assistant:

void Sbd_ManSolveSelect( Gia_Man_t * p, Vec_Int_t * vMirrors, int Pivot, Vec_Int_t * vDivVars, Vec_Int_t * vDivValues, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, Vec_Int_t * vTfo, Vec_Int_t * vRoots )
{
    Vec_Int_t * vSop = Vec_IntAlloc( 100 );
    Vec_Int_t * vTemp = Vec_IntAlloc( 100 );
    sat_solver * pSat = Sbd_ManSatSolver( NULL, p, vMirrors, Pivot, vWinObjs, vObj2Var, vTfo, vRoots, 0 );
    int PivotVar = Vec_IntEntry(vObj2Var, Pivot);
    int FreeVar = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots);
    int Status = Sbd_ManSolve2( pSat, PivotVar, FreeVar, vDivVars, vDivValues, vTemp, vSop );
    printf( "Pivot = %4d. Divs = %4d.  ", Pivot, Vec_IntSize(vDivVars) );
    if ( Status == 0 )
        printf( "UNSAT.\n" );
    else
    {
        int nVars, pInds[64];
        word Supp = Sbd_ManSolverSupp( vSop, pInds, &nVars );
        //Sbd_ManSolverPrint( vSop );
        printf( "SAT with %d vars and %d cubes.\n", nVars, Vec_IntCountEntry(vSop, -1) );
        Supp = 0;
    }
    Vec_IntFree( vTemp );
    Vec_IntFree( vSop );
    sat_solver_delete( pSat );
}